

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageStore.cpp
# Opt level: O2

void __thiscall
FIX::MessageStoreExceptionWrapper::get
          (MessageStoreExceptionWrapper *this,int begin,int end,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *msgs,bool *threw,IOException *ex)

{
  *threw = false;
  (**(code **)(**(long **)this + 0x18))();
  return;
}

Assistant:

void MessageStoreExceptionWrapper::get( int begin, int end, std::vector < std::string > & msgs, bool& threw, IOException& ex ) const
{
  threw = false;
  try { m_pStore->get( begin, end, msgs ); }
  catch ( IOException & e ) { threw = true; ex = e; }
}